

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O2

long Assimp::FBX::PropertyGet<long>(PropertyTable *in,string *name,long *defaultValue)

{
  Property *this;
  TypedProperty<long> *pTVar1;
  
  this = PropertyTable::Get(in,name);
  if (this != (Property *)0x0) {
    pTVar1 = Property::As<Assimp::FBX::TypedProperty<long>>(this);
    if (pTVar1 != (TypedProperty<long> *)0x0) {
      defaultValue = &pTVar1->value;
    }
  }
  return *defaultValue;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, const T& defaultValue) {
    const Property* const prop = in.Get(name);
    if( nullptr == prop) {
        return defaultValue;
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        return defaultValue;
    }

    return tprop->Value();
}